

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_low_entropy(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  
  piVar1 = strm->state;
  if (piVar1->bitp < 1) {
    sVar5 = strm->avail_in;
    iVar3 = piVar1->bitp + -8;
    do {
      sVar5 = sVar5 - 1;
      if (sVar5 == 0xffffffffffffffff) {
        return 0;
      }
      strm->avail_in = sVar5;
      uVar6 = piVar1->acc << 8;
      piVar1->acc = uVar6;
      pbVar2 = strm->next_in;
      strm->next_in = pbVar2 + 1;
      piVar1->acc = *pbVar2 | uVar6;
      piVar1->bitp = iVar3 + 0x10;
      iVar3 = iVar3 + 8;
    } while (iVar3 < -7);
  }
  uVar4 = piVar1->bitp - 1;
  piVar1->id = (uint)((piVar1->acc >> ((ulong)uVar4 & 0x3f) & 1) != 0);
  piVar1->bitp = uVar4;
  piVar1->mode = m_low_entropy_ref;
  return 1;
}

Assistant:

static int m_low_entropy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (bits_ask(strm, 1) == 0)
        return M_EXIT;
    state->id = bits_get(strm, 1);
    bits_drop(strm, 1);
    state->mode = m_low_entropy_ref;
    return M_CONTINUE;
}